

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Parser.cpp
# Opt level: O0

unique_ptr<enact::Stmt,_std::default_delete<enact::Stmt>_> __thiscall
enact::Parser::parseImplStmt(Parser *this)

{
  bool bVar1;
  ParseError *__return_storage_ptr__;
  Parser *in_RSI;
  byte local_17a;
  unique_ptr<const_enact::Typename,_std::default_delete<const_enact::Typename>_> local_140;
  undefined4 local_134;
  unique_ptr<const_enact::Typename,_std::default_delete<const_enact::Typename>_> local_130;
  allocator<char> local_121;
  string local_120;
  undefined1 local_fa;
  allocator<char> local_f9;
  string local_f8;
  undefined1 local_d8 [16];
  undefined1 local_c8 [8];
  vector<std::unique_ptr<enact::FunctionStmt,_std::default_delete<enact::FunctionStmt>_>,_std::allocator<std::unique_ptr<enact::FunctionStmt,_std::default_delete<enact::FunctionStmt>_>_>_>
  methods;
  string local_a8;
  byte local_83;
  byte local_82;
  allocator<char> local_81;
  string local_80 [32];
  undefined1 local_60 [8];
  unique_ptr<const_enact::Typename,_std::default_delete<const_enact::Typename>_> secondTypename;
  allocator<char> local_41;
  string local_40 [32];
  undefined1 local_20 [8];
  unique_ptr<const_enact::Typename,_std::default_delete<const_enact::Typename>_> firstTypename;
  Parser *this_local;
  
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (local_40,"Expected typename after \'impl\'.",&local_41);
  expectTypename((Parser *)local_20,(string *)in_RSI,SUB81(local_40,0));
  std::__cxx11::string::~string(local_40);
  std::allocator<char>::~allocator(&local_41);
  local_82 = 0;
  local_83 = 0;
  bVar1 = consume(in_RSI,FOR);
  if (bVar1) {
    std::allocator<char>::allocator();
    local_82 = 1;
    std::__cxx11::string::string<std::allocator<char>>
              (local_80,"Expected typename after \'impl\'..\'for\'.",&local_81);
    local_83 = 1;
    expectTypename((Parser *)local_60,(string *)in_RSI,SUB81(local_80,0));
  }
  else {
    std::unique_ptr<enact::Typename_const,std::default_delete<enact::Typename_const>>::
    unique_ptr<std::default_delete<enact::Typename_const>,void>
              ((unique_ptr<enact::Typename_const,std::default_delete<enact::Typename_const>> *)
               local_60,(nullptr_t)0x0);
  }
  if ((local_83 & 1) != 0) {
    std::__cxx11::string::~string(local_80);
  }
  if ((local_82 & 1) != 0) {
    std::allocator<char>::~allocator(&local_81);
  }
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_a8,"Expected \'{\' before impl body.",
             (allocator<char> *)
             ((long)&methods.
                     super__Vector_base<std::unique_ptr<enact::FunctionStmt,_std::default_delete<enact::FunctionStmt>_>,_std::allocator<std::unique_ptr<enact::FunctionStmt,_std::default_delete<enact::FunctionStmt>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_end_of_storage + 7));
  expect(in_RSI,LEFT_BRACE,&local_a8);
  std::__cxx11::string::~string((string *)&local_a8);
  std::allocator<char>::~allocator
            ((allocator<char> *)
             ((long)&methods.
                     super__Vector_base<std::unique_ptr<enact::FunctionStmt,_std::default_delete<enact::FunctionStmt>_>,_std::allocator<std::unique_ptr<enact::FunctionStmt,_std::default_delete<enact::FunctionStmt>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_end_of_storage + 7));
  std::
  vector<std::unique_ptr<enact::FunctionStmt,_std::default_delete<enact::FunctionStmt>_>,_std::allocator<std::unique_ptr<enact::FunctionStmt,_std::default_delete<enact::FunctionStmt>_>_>_>
  ::vector((vector<std::unique_ptr<enact::FunctionStmt,_std::default_delete<enact::FunctionStmt>_>,_std::allocator<std::unique_ptr<enact::FunctionStmt,_std::default_delete<enact::FunctionStmt>_>_>_>
            *)local_c8);
  while( true ) {
    bVar1 = check(in_RSI,RIGHT_BRACE);
    local_17a = 0;
    if (!bVar1) {
      bVar1 = isAtEnd(in_RSI);
      local_17a = bVar1 ^ 0xff;
    }
    if ((local_17a & 1) == 0) break;
    bVar1 = consume(in_RSI,FUNC);
    if (!bVar1) {
      local_fa = 1;
      __return_storage_ptr__ = (ParseError *)__cxa_allocate_exception(0x10);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_f8,"Expected method declaration in impl body.",&local_f9);
      errorAtCurrent(__return_storage_ptr__,in_RSI,&local_f8);
      local_fa = 0;
      __cxa_throw(__return_storage_ptr__,&ParseError::typeinfo,ParseError::~ParseError);
    }
    parseFunctionStmt((Parser *)local_d8,SUB81(in_RSI,0));
    static_unique_ptr_cast<enact::FunctionStmt,enact::Stmt>
              ((enact *)(local_d8 + 8),
               (unique_ptr<enact::Stmt,_std::default_delete<enact::Stmt>_> *)local_d8);
    std::
    vector<std::unique_ptr<enact::FunctionStmt,_std::default_delete<enact::FunctionStmt>_>,_std::allocator<std::unique_ptr<enact::FunctionStmt,_std::default_delete<enact::FunctionStmt>_>_>_>
    ::push_back((vector<std::unique_ptr<enact::FunctionStmt,_std::default_delete<enact::FunctionStmt>_>,_std::allocator<std::unique_ptr<enact::FunctionStmt,_std::default_delete<enact::FunctionStmt>_>_>_>
                 *)local_c8,(value_type *)(local_d8 + 8));
    std::unique_ptr<enact::FunctionStmt,_std::default_delete<enact::FunctionStmt>_>::~unique_ptr
              ((unique_ptr<enact::FunctionStmt,_std::default_delete<enact::FunctionStmt>_> *)
               (local_d8 + 8));
    std::unique_ptr<enact::Stmt,_std::default_delete<enact::Stmt>_>::~unique_ptr
              ((unique_ptr<enact::Stmt,_std::default_delete<enact::Stmt>_> *)local_d8);
  }
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_120,"Expected \'}\' after impl body.",&local_121);
  expect(in_RSI,RIGHT_BRACE,&local_120);
  std::__cxx11::string::~string((string *)&local_120);
  std::allocator<char>::~allocator(&local_121);
  bVar1 = std::operator==((unique_ptr<const_enact::Typename,_std::default_delete<const_enact::Typename>_>
                           *)local_60,(nullptr_t)0x0);
  if (bVar1) {
    std::
    make_unique<enact::ImplStmt,std::unique_ptr<enact::Typename_const,std::default_delete<enact::Typename_const>>,std::unique_ptr<enact::Typename_const,std::default_delete<enact::Typename_const>>,std::vector<std::unique_ptr<enact::FunctionStmt,std::default_delete<enact::FunctionStmt>>,std::allocator<std::unique_ptr<enact::FunctionStmt,std::default_delete<enact::FunctionStmt>>>>>
              (&local_130,
               (unique_ptr<const_enact::Typename,_std::default_delete<const_enact::Typename>_> *)
               local_20,(vector<std::unique_ptr<enact::FunctionStmt,_std::default_delete<enact::FunctionStmt>_>,_std::allocator<std::unique_ptr<enact::FunctionStmt,_std::default_delete<enact::FunctionStmt>_>_>_>
                         *)local_60);
    std::unique_ptr<enact::Stmt,std::default_delete<enact::Stmt>>::
    unique_ptr<enact::ImplStmt,std::default_delete<enact::ImplStmt>,void>
              ((unique_ptr<enact::Stmt,std::default_delete<enact::Stmt>> *)this,
               (unique_ptr<enact::ImplStmt,_std::default_delete<enact::ImplStmt>_> *)&local_130);
    std::unique_ptr<enact::ImplStmt,_std::default_delete<enact::ImplStmt>_>::~unique_ptr
              ((unique_ptr<enact::ImplStmt,_std::default_delete<enact::ImplStmt>_> *)&local_130);
  }
  else {
    std::
    make_unique<enact::ImplStmt,std::unique_ptr<enact::Typename_const,std::default_delete<enact::Typename_const>>,std::unique_ptr<enact::Typename_const,std::default_delete<enact::Typename_const>>,std::vector<std::unique_ptr<enact::FunctionStmt,std::default_delete<enact::FunctionStmt>>,std::allocator<std::unique_ptr<enact::FunctionStmt,std::default_delete<enact::FunctionStmt>>>>>
              (&local_140,
               (unique_ptr<const_enact::Typename,_std::default_delete<const_enact::Typename>_> *)
               local_60,(vector<std::unique_ptr<enact::FunctionStmt,_std::default_delete<enact::FunctionStmt>_>,_std::allocator<std::unique_ptr<enact::FunctionStmt,_std::default_delete<enact::FunctionStmt>_>_>_>
                         *)local_20);
    std::unique_ptr<enact::Stmt,std::default_delete<enact::Stmt>>::
    unique_ptr<enact::ImplStmt,std::default_delete<enact::ImplStmt>,void>
              ((unique_ptr<enact::Stmt,std::default_delete<enact::Stmt>> *)this,
               (unique_ptr<enact::ImplStmt,_std::default_delete<enact::ImplStmt>_> *)&local_140);
    std::unique_ptr<enact::ImplStmt,_std::default_delete<enact::ImplStmt>_>::~unique_ptr
              ((unique_ptr<enact::ImplStmt,_std::default_delete<enact::ImplStmt>_> *)&local_140);
  }
  local_134 = 1;
  std::
  vector<std::unique_ptr<enact::FunctionStmt,_std::default_delete<enact::FunctionStmt>_>,_std::allocator<std::unique_ptr<enact::FunctionStmt,_std::default_delete<enact::FunctionStmt>_>_>_>
  ::~vector((vector<std::unique_ptr<enact::FunctionStmt,_std::default_delete<enact::FunctionStmt>_>,_std::allocator<std::unique_ptr<enact::FunctionStmt,_std::default_delete<enact::FunctionStmt>_>_>_>
             *)local_c8);
  std::unique_ptr<const_enact::Typename,_std::default_delete<const_enact::Typename>_>::~unique_ptr
            ((unique_ptr<const_enact::Typename,_std::default_delete<const_enact::Typename>_> *)
             local_60);
  std::unique_ptr<const_enact::Typename,_std::default_delete<const_enact::Typename>_>::~unique_ptr
            ((unique_ptr<const_enact::Typename,_std::default_delete<const_enact::Typename>_> *)
             local_20);
  return (__uniq_ptr_data<enact::Stmt,_std::default_delete<enact::Stmt>,_true,_true>)
         (__uniq_ptr_data<enact::Stmt,_std::default_delete<enact::Stmt>,_true,_true>)this;
}

Assistant:

std::unique_ptr<Stmt> Parser::parseImplStmt() {
        std::unique_ptr<const Typename> firstTypename = expectTypename("Expected typename after 'impl'.");
        std::unique_ptr<const Typename> secondTypename = consume(TokenType::FOR)
                                                         ? expectTypename("Expected typename after 'impl'..'for'.")
                                                         : nullptr;

        expect(TokenType::LEFT_BRACE, "Expected '{' before impl body.");

        std::vector<std::unique_ptr<FunctionStmt>> methods;
        while (!check(TokenType::RIGHT_BRACE) && !isAtEnd()) {
            if (consume(TokenType::FUNC)) {
                methods.push_back(
                        static_unique_ptr_cast<FunctionStmt>(
                                parseFunctionStmt()));
            } else {
                throw errorAtCurrent("Expected method declaration in impl body.");
            }
        }

        expect(TokenType::RIGHT_BRACE, "Expected '}' after impl body.");

        if (secondTypename == nullptr) {
            // Inherent impl
            return std::make_unique<ImplStmt>(std::move(firstTypename), std::move(secondTypename), std::move(methods));
        }
        // Trait impl
        return std::make_unique<ImplStmt>(std::move(secondTypename), std::move(firstTypename), std::move(methods));
    }